

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

void Unr_ManFree(Unr_Man_t *p)

{
  Unr_Man_t *p_local;
  
  Gia_ManStop(p->pFrames);
  Vec_IntFreeP(&p->vOrder);
  Vec_IntFreeP(&p->vOrderLim);
  Vec_IntFreeP(&p->vTents);
  Vec_IntFreeP(&p->vRanks);
  Vec_IntFreeP(&p->vObjLim);
  Vec_IntFreeP(&p->vCiMap);
  Vec_IntFreeP(&p->vCoMap);
  Vec_IntFreeP(&p->vPiLits);
  if (p->pObjs != (int *)0x0) {
    free(p->pObjs);
    p->pObjs = (int *)0x0;
  }
  if (p != (Unr_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Unr_ManFree( Unr_Man_t * p )
{
    Gia_ManStop( p->pFrames );
    // intermediate data
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vOrderLim );
    Vec_IntFreeP( &p->vTents );
    Vec_IntFreeP( &p->vRanks );
    // unrolling data
    Vec_IntFreeP( &p->vObjLim );
    Vec_IntFreeP( &p->vCiMap );
    Vec_IntFreeP( &p->vCoMap );
    Vec_IntFreeP( &p->vPiLits );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}